

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# succinct_bitvector.h
# Opt level: O2

void __thiscall
bwtil::succinct_bitvector::succinct_bitvector
          (succinct_bitvector *this,vector<bool,_std::allocator<bool>_> *vb)

{
  ulint i;
  ulong __n;
  reference rVar1;
  
  *(undefined8 *)
   ((long)&(this->bitvector).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->rank_ptrs_1).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 2) = 0;
  *(undefined8 *)
   ((long)&(this->rank_ptrs_1).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->rank_ptrs_1).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->rank_ptrs_2).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start + 2) = 0;
  *(undefined8 *)
   ((long)&(this->rank_ptrs_2).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->rank_ptrs_2).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)((long)&this->global_rank1 + 2) = 0;
  this->n = 0;
  (this->bitvector).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bitvector).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bitvector).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rank_ptrs_1).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rank_ptrs_1).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rank_ptrs_1).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rank_ptrs_2).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  for (__n = 0; __n < (ulong)(vb->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      ((long)(vb->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      (long)(vb->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      __n = __n + 1) {
    rVar1 = std::vector<bool,_std::allocator<bool>_>::at(vb,__n);
    push_back(this,(*rVar1._M_p & rVar1._M_mask) != 0);
  }
  return;
}

Assistant:

succinct_bitvector(vector<bool> &vb){

		n=0;
		global_rank1=0;
		local_rank1=0;

		for(ulint i=0;i<vb.size();i++)
			push_back(vb.at(i));

	}